

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
          (ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *this,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> begin,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> end,char *sep,
          int precedence)

{
  undefined8 *puVar1;
  size_t __n;
  ulong uVar2;
  long lVar3;
  char *str;
  ptrdiff_t _Num;
  
  puVar1 = *(undefined8 **)(*(long *)(this + 8) + 8);
  lVar3 = puVar1[2];
  if (lVar3 == puVar1[3]) {
    (**(code **)*puVar1)(puVar1,lVar3 + 1);
    lVar3 = puVar1[2];
  }
  puVar1[2] = lVar3 + 1;
  *(undefined1 *)(puVar1[1] + lVar3) = 0x28;
  if (begin.ptr_ != end.ptr_) {
    while( true ) {
      ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
                ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this,
                 (NumericExpr)((ExprBase *)begin.ptr_)->impl_,precedence);
      begin.ptr_ = begin.ptr_ + 1;
      if (begin.ptr_ == end.ptr_) break;
      lVar3 = *(long *)(this + 8);
      __n = strlen(sep);
      puVar1 = *(undefined8 **)(lVar3 + 8);
      uVar2 = puVar1[2] + __n;
      if ((ulong)puVar1[3] < uVar2) {
        (**(code **)*puVar1)(puVar1,uVar2);
      }
      if (__n != 0) {
        memmove((void *)(puVar1[1] + puVar1[2]),sep,__n);
      }
      puVar1[2] = uVar2;
    }
  }
  puVar1 = *(undefined8 **)(*(long *)(this + 8) + 8);
  lVar3 = puVar1[2];
  if (lVar3 == puVar1[3]) {
    (**(code **)*puVar1)(puVar1,lVar3 + 1);
    lVar3 = puVar1[2];
  }
  puVar1[2] = lVar3 + 1;
  *(undefined1 *)(puVar1[1] + lVar3) = 0x29;
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteArgs(
    Iter begin, Iter end, const char *sep, int precedence) {
  writer_ << '(';
  if (begin != end) {
    Visit(*begin, precedence);
    for (++begin; begin != end; ++begin) {
      writer_ << sep;
      Visit(*begin, precedence);
    }
  }
  writer_ << ')';
}